

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O2

void fe::operations::
     applyOperationT<fe::operations::op_premultipliedAlpha,fe::PixelA8,fe::PixelR8G8B8A8>
               (op_premultipliedAlpha *op,PixelA8 *srcPixelFormat,PixelR8G8B8A8 *destPixelFormat,
               ImageData *src,ImageData *dest)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  uint8_t uVar5;
  byte *pbVar6;
  uint8_t *puVar7;
  int y;
  int iVar8;
  int iVar9;
  uchar *destLine;
  uint8_t *puVar10;
  uchar *srcLine;
  byte *pbVar11;
  
  bVar4 = check(src,dest);
  if (bVar4) {
    pbVar6 = (src->super_fe_image).data;
    puVar7 = (dest->super_fe_image).data;
    iVar2 = (dest->super_fe_image).w;
    iVar3 = (dest->super_fe_image).h;
    for (iVar8 = 0; puVar10 = puVar7, pbVar11 = pbVar6, iVar9 = iVar2, iVar8 != iVar3;
        iVar8 = iVar8 + 1) {
      while (iVar9 != 0) {
        bVar1 = *pbVar11;
        uVar5 = (uint8_t)(((uint)bVar1 * (uint)bVar1) / 0xff);
        *puVar10 = uVar5;
        puVar10[1] = uVar5;
        puVar10[2] = uVar5;
        puVar10[3] = bVar1;
        puVar10 = puVar10 + (dest->super_fe_image).bytespp;
        pbVar11 = pbVar11 + (src->super_fe_image).bytespp;
        iVar9 = iVar9 + -1;
      }
      pbVar6 = pbVar6 + (src->super_fe_image).pitch;
      puVar7 = puVar7 + (dest->super_fe_image).pitch;
    }
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }